

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  size_t __n;
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  byte bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t *puVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar15;
  void *pvVar16;
  secp256k1_gej *r_00;
  size_t sVar17;
  ulong uVar18;
  secp256k1_gej *psVar19;
  int iVar20;
  secp256k1_fe *rzr;
  size_t checkpoint;
  secp256k1_ge *psVar21;
  secp256k1_scalar *psVar22;
  int iVar23;
  secp256k1_ge *psVar24;
  int *__s;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  size_t sVar33;
  byte bVar34;
  undefined1 auVar35 [16];
  secp256k1_gej running_sum;
  ulong local_160;
  long local_158;
  size_t local_138;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  int local_40;
  
  bVar34 = 0;
  lVar14 = 0;
  do {
    if (scratch->magic[lVar14] != "scratch"[lVar14]) {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
      checkpoint = 0;
      goto LAB_00135b43;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 8);
  checkpoint = scratch->alloc_size;
LAB_00135b43:
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  iVar20 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar14 = n_points * 2 + 2;
    local_160 = 1;
    if ((((((1 < n_points) && (local_160 = 2, 4 < n_points)) && (local_160 = 3, 0x14 < n_points)) &&
         ((local_160 = 4, 0x39 < n_points && (local_160 = 5, 0x88 < n_points)))) &&
        ((local_160 = 6, 0xeb < n_points &&
         ((local_160 = 7, 0x4ec < n_points && (local_160 = 9, 0x1144 < n_points)))))) &&
       (local_160 = 10, 0x1ec8 < n_points)) {
      local_160 = (ulong)(0xc - (n_points < 0x3eb3));
    }
    local_138 = n_points;
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar14 * 0x58);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar14 * 0x20);
    plVar15 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar15 != (long *)0x0 && s1 != (secp256k1_scalar *)0x0) && p1 != (secp256k1_ge *)0x0) {
      pvVar16 = secp256k1_scratch_alloc(error_callback,scratch,lVar14 * 0x10);
      plVar15[1] = (long)pvVar16;
      iVar20 = (uint)local_160 + 1;
      bVar10 = 0x7f / (byte)iVar20;
      uVar18 = (ulong)bVar10;
      pvVar16 = secp256k1_scratch_alloc(error_callback,scratch,lVar14 * (ulong)(bVar10 + 1) * 4);
      *plVar15 = (long)pvVar16;
      bVar5 = (byte)local_160;
      r_00 = (secp256k1_gej *)
             secp256k1_scratch_alloc(error_callback,scratch,0x80L << (bVar5 & 0x3f));
      if (((plVar15[1] != 0) && (*plVar15 != 0)) && (r_00 != (secp256k1_gej *)0x0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar14 = 0;
        }
        else {
          uVar6 = inp_g_sc->d[0];
          uVar7 = inp_g_sc->d[1];
          uVar8 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar8;
          s1->d[0] = uVar6;
          s1->d[1] = uVar7;
          psVar21 = &secp256k1_ge_const_g;
          psVar24 = p1;
          for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
            (psVar24->x).n[0] = (psVar21->x).n[0];
            psVar21 = (secp256k1_ge *)((long)psVar21 + ((ulong)bVar34 * -2 + 1) * 8);
            psVar24 = (secp256k1_ge *)((long)psVar24 + (ulong)bVar34 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar14 = 2;
        }
        if (n_points != 0) {
          psVar22 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)lVar14 << 5));
          psVar21 = p1 + lVar14;
          do {
            iVar11 = (*cb)(psVar22,psVar21,cb_offset,cbdata);
            if (iVar11 == 0) goto LAB_00135da5;
            secp256k1_ecmult_endo_split(psVar22,psVar22 + 1,psVar21,psVar21 + 1);
            lVar14 = lVar14 + 2;
            cb_offset = cb_offset + 1;
            psVar22 = psVar22 + 2;
            psVar21 = psVar21 + 2;
            local_138 = local_138 - 1;
          } while (local_138 != 0);
        }
        if (lVar14 == 0) {
          r->infinity = 1;
          (r->x).n[0] = 0;
          (r->x).n[1] = 0;
          (r->x).n[2] = 0;
          (r->x).n[3] = 0;
          *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
          (r->y).n[1] = 0;
          (r->y).n[2] = 0;
          (r->y).n[3] = 0;
          (r->y).n[4] = 0;
          (r->z).n[0] = 0;
          (r->z).n[1] = 0;
          (r->z).n[2] = 0;
          (r->z).n[3] = 0;
          (r->z).n[4] = 0;
        }
        else {
          iVar23 = -2 << (bVar5 & 0x1f);
          iVar11 = 0x80 - iVar20 * (uint)bVar10;
          __n = uVar18 * 4 + 4;
          lVar32 = 0;
          local_138 = 0;
          sVar17 = __n;
          do {
            psVar22 = s1 + lVar32;
            puVar9 = s1[lVar32].d;
            auVar35._0_4_ = -(uint)((int)puVar9[2] == 0 && (int)psVar22->d[0] == 0);
            auVar35._4_4_ =
                 -(uint)(*(int *)((long)puVar9 + 0x14) == 0 && *(int *)((long)psVar22->d + 4) == 0);
            auVar35._8_4_ = -(uint)((int)(puVar9 + 2)[1] == 0 && (int)psVar22->d[1] == 0);
            auVar35._12_4_ =
                 -(uint)(*(int *)((long)puVar9 + 0x1c) == 0 && *(int *)((long)psVar22->d + 0xc) == 0
                        );
            uVar12 = movmskps((int)sVar17,auVar35);
            sVar17 = (size_t)(uVar12 ^ 0xf);
            if (((uVar12 ^ 0xf) != 0) && (sVar17 = lVar32 * 0x58, p1[lVar32].infinity == 0)) {
              psVar22 = s1 + lVar32;
              sVar17 = plVar15[1];
              *(long *)(sVar17 + 8 + local_138 * 0x10) = lVar32;
              __s = (int *)(local_138 * (bVar10 + 1) * 4 + *plVar15);
              if (((psVar22->d[1] == 0 && psVar22->d[2] == 0) && psVar22->d[3] == 0) &&
                  psVar22->d[0] == 0) {
                uVar12 = 0;
                memset(__s,0,__n);
              }
              else {
                uVar25 = (uint)psVar22->d[0];
                uVar12 = ~uVar25 & 1;
                *__s = (0xffffffffU >> (~bVar5 & 0x1f) & uVar25) + uVar12;
                uVar25 = iVar20 * (uint)bVar10;
                lVar27 = 0;
                uVar31 = uVar18;
                do {
                  iVar13 = iVar20;
                  if (lVar27 == 0) {
                    iVar13 = iVar11;
                  }
                  uVar28 = (iVar13 + uVar25) - 1 >> 6;
                  uVar29 = uVar25 >> 6;
                  if (uVar28 == uVar29) {
                    uVar28 = (uint)(psVar22->d[uVar28] >> ((byte)uVar25 & 0x3f));
                  }
                  else {
                    bVar34 = (byte)uVar25 & 0x3f;
                    uVar28 = (uint)(psVar22->d[uVar29] >> bVar34) |
                             (uint)(psVar22->d[(ulong)uVar29 + 1] << 0x40 - bVar34);
                  }
                  if (uVar28 << (-(char)iVar13 & 0x1fU) != 0) goto LAB_00136017;
                  __s[uVar31] = 0;
                  uVar25 = uVar25 + ~(uint)local_160;
                  lVar27 = lVar27 + 1;
                  bVar2 = 1 < (long)uVar31;
                  uVar31 = uVar31 - 1;
                } while (bVar2);
                uVar31 = 0;
LAB_00136017:
                if (0 < (int)uVar31) {
                  uVar26 = 1;
                  uVar30 = local_160;
                  do {
                    iVar13 = iVar20;
                    if (uVar18 == uVar26) {
                      iVar13 = iVar11;
                    }
                    iVar4 = (int)uVar30;
                    uVar25 = (uint)(iVar13 + iVar4) >> 6;
                    uVar28 = iVar4 + 1U >> 6;
                    bVar34 = (byte)(iVar4 + 1U);
                    if (uVar25 == uVar28) {
                      uVar25 = (uint)(psVar22->d[uVar25] >> (bVar34 & 0x3f));
                    }
                    else {
                      bVar34 = bVar34 & 0x3f;
                      uVar25 = (uint)(psVar22->d[uVar28] >> bVar34) |
                               (uint)(psVar22->d[(ulong)uVar28 + 1] << 0x40 - bVar34);
                    }
                    uVar28 = (uVar25 << (-(char)iVar13 & 0x1fU)) >> (-(char)iVar13 & 0x1fU);
                    if ((uVar25 & 1) == 0) {
                      __s[uVar26 - 1] = __s[uVar26 - 1] + iVar23;
                      uVar28 = uVar28 | 1;
                    }
                    __s[uVar26] = uVar28;
                    if (1 < uVar26) {
                      if (__s[uVar26 - 1] == -1) {
                        if (0 < __s[uVar26 - 2]) {
                          iVar13 = __s[uVar26 - 2] + iVar23;
                          goto LAB_001360c6;
                        }
                      }
                      else if ((__s[uVar26 - 1] == 1) && (__s[uVar26 - 2] < 0)) {
                        iVar13 = __s[uVar26 - 2] + (2 << (bVar5 & 0x1f));
LAB_001360c6:
                        __s[uVar26 - 2] = iVar13;
                        __s[uVar26 - 1] = 0;
                      }
                    }
                    uVar26 = uVar26 + 1;
                    uVar30 = (ulong)(uint)(iVar4 + iVar20);
                  } while ((int)uVar31 + 1 != uVar26);
                }
              }
              *(uint *)(sVar17 + local_138 * 0x10) = uVar12;
              local_138 = local_138 + 1;
            }
            lVar32 = lVar32 + 1;
          } while (lVar32 != lVar14);
          r->infinity = 1;
          (r->x).n[0] = 0;
          (r->x).n[1] = 0;
          (r->x).n[2] = 0;
          (r->x).n[3] = 0;
          *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
          (r->y).n[1] = 0;
          (r->y).n[2] = 0;
          (r->y).n[3] = 0;
          (r->y).n[4] = 0;
          (r->z).n[0] = 0;
          (r->z).n[1] = 0;
          (r->z).n[2] = 0;
          (r->z).n[3] = 0;
          (r->z).n[4] = 0;
          if (local_138 != 0) {
            lVar27 = 1L << (bVar5 & 0x3f);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_160 + 1;
            auVar3 = (ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar3;
            uVar31 = (ulong)(uint)(auVar3._0_4_ << 2);
            lVar14 = uVar31 + 4;
            uVar18 = (ulong)((int)lVar27 - 2);
            psVar19 = r_00;
            lVar32 = lVar27;
            local_158 = auVar3._0_8_;
            do {
              do {
                psVar19->infinity = 1;
                (psVar19->x).n[0] = 0;
                (psVar19->x).n[1] = 0;
                (psVar19->x).n[2] = 0;
                (psVar19->x).n[3] = 0;
                *(undefined1 (*) [16])((psVar19->x).n + 4) = (undefined1  [16])0x0;
                (psVar19->y).n[1] = 0;
                (psVar19->y).n[2] = 0;
                (psVar19->y).n[3] = 0;
                (psVar19->y).n[4] = 0;
                (psVar19->z).n[0] = 0;
                (psVar19->z).n[1] = 0;
                (psVar19->z).n[2] = 0;
                (psVar19->z).n[3] = 0;
                (psVar19->z).n[4] = 0;
                lVar32 = lVar32 + -1;
                psVar19 = psVar19 + 1;
              } while (lVar32 != 0);
              lVar32 = 8;
              uVar30 = uVar31;
              sVar33 = local_138;
              do {
                rzr = (secp256k1_fe *)*plVar15;
                uVar12 = *(uint *)((long)rzr->n + uVar30);
                lVar1 = *(long *)(plVar15[1] + lVar32);
                if ((local_158 == 0) && (*(int *)(plVar15[1] + -8 + lVar32) != 0)) {
                  secp256k1_ge_neg((secp256k1_ge *)local_b8,p1 + lVar1);
                  rzr = (secp256k1_fe *)0x0;
                  secp256k1_gej_add_ge_var(r_00,r_00,(secp256k1_ge *)local_b8,(secp256k1_fe *)0x0);
                }
                if ((int)uVar12 < 1) {
                  if ((int)uVar12 < 0) {
                    uVar12 = ~uVar12;
                    psVar21 = (secp256k1_ge *)local_b8;
                    secp256k1_ge_neg(psVar21,p1 + lVar1);
                    goto LAB_0013629e;
                  }
                }
                else {
                  uVar12 = uVar12 - 1;
                  psVar21 = p1 + lVar1;
LAB_0013629e:
                  rzr = (secp256k1_fe *)0x0;
                  secp256k1_gej_add_ge_var
                            (r_00 + (uVar12 >> 1),r_00 + (uVar12 >> 1),psVar21,(secp256k1_fe *)0x0);
                }
                lVar32 = lVar32 + 0x10;
                uVar30 = uVar30 + lVar14;
                sVar33 = sVar33 + -1;
              } while (sVar33 != 0);
              uVar30 = local_160;
              do {
                if (r->infinity == 0) {
                  secp256k1_gej_double(r,r);
                }
                else {
                  r->infinity = 1;
                  (r->x).n[0] = 0;
                  (r->x).n[1] = 0;
                  (r->x).n[2] = 0;
                  (r->x).n[3] = 0;
                  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
                  (r->y).n[1] = 0;
                  (r->y).n[2] = 0;
                  (r->y).n[3] = 0;
                  (r->y).n[4] = 0;
                  (r->z).n[0] = 0;
                  (r->z).n[1] = 0;
                  (r->z).n[2] = 0;
                  (r->z).n[3] = 0;
                  (r->z).n[4] = 0;
                }
                uVar12 = (int)uVar30 - 1;
                uVar30 = (ulong)uVar12;
              } while (uVar12 != 0);
              local_40 = 1;
              local_b8._0_16_ = (undefined1  [16])0x0;
              local_b8._16_16_ = (undefined1  [16])0x0;
              local_98 = (undefined1  [16])0x0;
              local_88 = (undefined1  [16])0x0;
              local_78 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              local_58 = (undefined1  [16])0x0;
              local_48 = 0;
              lVar32 = uVar18 + 2;
              psVar19 = r_00 + uVar18 + 1;
              do {
                secp256k1_gej_add_var
                          ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,psVar19,rzr);
                secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,rzr);
                lVar32 = lVar32 + -1;
                psVar19 = psVar19 + -1;
              } while (1 < lVar32);
              secp256k1_gej_add_var((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,r_00,rzr);
              if (r->infinity == 0) {
                secp256k1_gej_double(r,r);
              }
              else {
                r->infinity = 1;
                (r->x).n[0] = 0;
                (r->x).n[1] = 0;
                (r->x).n[2] = 0;
                (r->x).n[3] = 0;
                *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
                (r->y).n[1] = 0;
                (r->y).n[2] = 0;
                (r->y).n[3] = 0;
                (r->y).n[4] = 0;
                (r->z).n[0] = 0;
                (r->z).n[1] = 0;
                (r->z).n[2] = 0;
                (r->z).n[3] = 0;
                (r->z).n[4] = 0;
              }
              secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,rzr);
              uVar31 = uVar31 - 4;
              bVar2 = 0 < local_158;
              psVar19 = r_00;
              lVar32 = lVar27;
              local_158 = local_158 + -1;
            } while (bVar2);
          }
        }
        secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
        return 1;
      }
    }
LAB_00135da5:
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
    iVar20 = 0;
  }
  return iVar20;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}